

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O2

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::matchNextAux
          (GenMatcher *this,TermList queryTerm,TermList nodeTerm,bool separate)

{
  ArrayMapEntry<Kernel::TermList> *pAVar1;
  bool bVar2;
  int iVar3;
  undefined7 in_register_00000009;
  uint *puVar4;
  Term *nt;
  char cVar5;
  Binder binder;
  Binder local_30;
  
  local_30._parent = this;
  if ((nodeTerm._content & 3) == 0) {
    if (((*(byte *)(nodeTerm._content + 0x28) & 8) == 0) ||
       (bVar2 = Kernel::Term::ground((Term *)nodeTerm._content), !bVar2)) {
      local_30._maxVar = this->_maxVar;
      if (((queryTerm._content & 3) == 0) &&
         (*(int *)(queryTerm._content + 8) == *(int *)(nodeTerm._content + 8))) {
        cVar5 = Kernel::MatchingUtils::
                matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
                          ((Term *)nodeTerm._content,(Term *)queryTerm._content,&local_30);
      }
      else {
        cVar5 = '\0';
      }
    }
    else {
      cVar5 = nodeTerm._content == queryTerm._content;
    }
  }
  else {
    local_30._maxVar = this->_maxVar;
    iVar3 = Binder::bind(&local_30,(int)(nodeTerm._content >> 2),(sockaddr *)queryTerm._content,
                         (socklen_t)CONCAT71(in_register_00000009,separate));
    cVar5 = (char)iVar3;
  }
  if (separate && cVar5 == '\0') {
    puVar4 = (this->_boundVars)._cursor;
    pAVar1 = (this->_bindings).super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._array;
    while( true ) {
      puVar4 = puVar4 + -1;
      if ((ulong)*puVar4 == 0xffffffff) break;
      pAVar1[*puVar4]._timestamp = 0;
    }
    (this->_boundVars)._cursor = puVar4;
  }
  return (bool)cVar5;
}

Assistant:

bool SubstitutionTree<LeafData_>::GenMatcher::matchNextAux(TermList queryTerm, TermList nodeTerm, bool separate)
{
  bool success;
  if(nodeTerm.isTerm()) {
    Term* nt=nodeTerm.term();
    if(nt->shared() && nt->ground()) {
      //ground terms match only iff they're equal
      success = nodeTerm==queryTerm;
    } else {
      Binder binder(this);
      ASS(nt->arity()>0);

      success = queryTerm.isTerm() && queryTerm.term()->functor()==nt->functor() &&
	MatchingUtils::matchArgs(nt, queryTerm.term(), binder);
    }
  } else {
    ASS_METHOD(nodeTerm,isOrdinaryVar());
    unsigned var=nodeTerm.var();
    Binder binder(this);
    success=binder.bind(var,queryTerm);
  }

  if(!success) {
    //if this matching was joined to the previous one, we don't
    //have to care about unbinding as caller will do this by calling
    //backtrack for the matching we're joined to.
    if(separate) {
      //we have to unbind ordinary variables, that were bound.
      for(;;) {
	unsigned boundVar = _boundVars.pop();
	if(boundVar==BACKTRACK_SEPARATOR) {
	  break;
	}
	_bindings.remove(boundVar);
      }
    }
  }

  return success;
}